

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  char *__src;
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  size_t sVar5;
  ssize_t sVar6;
  uchar *puVar7;
  char *pcVar8;
  ulong uVar9;
  char local_75;
  libssh2_socket_t local_74;
  key_exchange_state_t *local_70;
  uchar *local_68;
  uchar *local_60;
  packet_require_state_t *local_58;
  size_t *local_50;
  uchar **local_48;
  uchar *local_40;
  time_t local_38;
  
  local_74 = sock;
  local_38 = time((time_t *)0x0);
  if (session == (LIBSSH2_SESSION *)0x0) {
    fprintf(_stderr,"Session is NULL, error: %i\n",0xfffffff2);
    return -0xe;
  }
  __src = session->banner_TxRx_banner;
  local_70 = &session->startup_key_state;
  local_40 = session->startup_service;
  local_60 = session->startup_service + 1;
  local_68 = session->startup_service + 5;
  local_48 = &session->startup_data;
  local_50 = &session->startup_data_len;
  local_58 = &session->startup_req_state;
LAB_00120c17:
  switch(session->startup_state) {
  case libssh2_NB_state_idle:
    if (local_74 == -1) {
      iVar3 = -0x2d;
      pcVar8 = "Bad socket provided";
    }
    else {
      session->socket_fd = local_74;
      uVar2 = fcntl(local_74,3,0);
      uVar2 = uVar2 >> 0xb & 1;
      session->socket_prev_blockstate = uVar2 ^ 1;
      if ((uVar2 != 0) || (iVar3 = session_nonblock(session->socket_fd,1), iVar3 == 0)) {
        session->startup_state = libssh2_NB_state_created;
        goto switchD_00120c35_caseD_2;
      }
      pcVar8 = "Failed changing socket\'s blocking state to non-blocking";
    }
    goto LAB_001210cb;
  default:
    return -0x22;
  case libssh2_NB_state_created:
switchD_00120c35_caseD_2:
    pcVar8 = "SSH-2.0-libssh2_1.11.2_DEV\r\n";
    sVar5 = 0x1c;
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      puVar7 = (session->local).banner;
      pcVar8 = "SSH-2.0-libssh2_1.11.2_DEV\r\n";
      if (puVar7 != (uchar *)0x0) {
        sVar5 = strlen((char *)puVar7);
        pcVar8 = (char *)puVar7;
      }
      session->banner_TxRx_state = libssh2_NB_state_created;
    }
    *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
    sVar6 = (*session->send)(session->socket_fd,(uchar *)pcVar8 + session->banner_TxRx_total_send,
                             sVar5 - session->banner_TxRx_total_send,
                             (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
    if (sVar6 == sVar5 - session->banner_TxRx_total_send) {
      session->banner_TxRx_total_send = 0;
      session->startup_state = libssh2_NB_state_sent;
      session->banner_TxRx_state = libssh2_NB_state_idle;
      break;
    }
    if (sVar6 < 0 && sVar6 != -0xb) {
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
      iVar3 = -0x2b;
      pcVar8 = "Failed sending banner";
      goto LAB_001210cb;
    }
    session->socket_block_directions = 2;
    if (0 < sVar6) {
      session->banner_TxRx_total_send = session->banner_TxRx_total_send + sVar6;
    }
    goto LAB_001210d8;
  case libssh2_NB_state_sent:
    break;
  case libssh2_NB_state_sent1:
    goto switchD_00120c35_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00120c35_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_00120c35_caseD_6;
  case libssh2_NB_state_sent4:
    goto switchD_00120c35_caseD_7;
  }
  do {
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      session->banner_TxRx_state = libssh2_NB_state_created;
      goto LAB_00120d51;
    }
    uVar9 = session->banner_TxRx_total_send;
    while ((uVar9 < 0x2000 && ((uVar9 == 0 || (__src[uVar9 - 1] != '\n'))))) {
      local_75 = '\0';
      *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfe;
      sVar6 = (*session->recv)(session->socket_fd,&local_75,1,
                               (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
      if (sVar6 < 0) {
        if (sVar6 == -0xb) {
          session->socket_block_directions = 1;
          session->banner_TxRx_total_send = uVar9;
          iVar3 = -0x25;
        }
        else {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar3 = -0x2b;
        }
        goto LAB_00120e91;
      }
      if (sVar6 == 0) {
        session->socket_state = -1;
        iVar3 = -0xd;
        goto LAB_00120e91;
      }
      if ((uVar9 == 0) && (local_75 == '\r' || local_75 == '\n')) {
LAB_00120d51:
        uVar9 = 0;
      }
      else {
        if (local_75 == '\0') {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar3 = -2;
          goto LAB_00120e91;
        }
        __src[uVar9] = local_75;
        uVar9 = uVar9 + 1;
      }
    }
    do {
      sVar5 = uVar9;
      if (sVar5 == 0) {
        session->banner_TxRx_state = libssh2_NB_state_idle;
        session->banner_TxRx_total_send = 0;
        iVar3 = -2;
        goto LAB_00120ee4;
      }
      uVar9 = sVar5 - 1;
    } while ((session->banner_TxRx_banner[sVar5 - 1] == '\r') ||
            (session->banner_TxRx_banner[sVar5 - 1] == '\n'));
    session->banner_TxRx_state = libssh2_NB_state_idle;
    session->banner_TxRx_total_send = 0;
    puVar7 = (session->remote).banner;
    if (puVar7 != (uchar *)0x0) {
      (*session->free)(puVar7,&session->abstract);
    }
    puVar7 = (uchar *)(*session->alloc)(sVar5 + 1,&session->abstract);
    (session->remote).banner = puVar7;
    if (puVar7 == (uchar *)0x0) {
      iVar3 = _libssh2_error(session,-6,"Error allocating space for remote banner");
LAB_00120e91:
      if (iVar3 != 0) {
        if (iVar3 == -0x25) goto LAB_001210d8;
LAB_00120ee4:
        pcVar8 = "Failed getting banner";
        goto LAB_001210cb;
      }
    }
    else {
      memcpy(puVar7,__src,sVar5);
      (session->remote).banner[sVar5] = '\0';
    }
    iVar3 = strncmp("SSH-",(char *)(session->remote).banner,4);
  } while (iVar3 != 0);
  session->startup_state = libssh2_NB_state_sent1;
switchD_00120c35_caseD_4:
  iVar3 = _libssh2_kex_exchange(session,0,local_70);
  if (iVar3 != -0x25) {
    if (iVar3 == 0) {
      session->startup_state = libssh2_NB_state_sent2;
switchD_00120c35_caseD_5:
      session->startup_service[0] = '\x05';
      _libssh2_htonu32(local_60,0xc);
      builtin_memcpy(local_68,"ssh-userauth",0xc);
      session->startup_state = libssh2_NB_state_sent3;
switchD_00120c35_caseD_6:
      iVar3 = _libssh2_transport_send(session,local_40,0x11,(uchar *)0x0,0);
      if (iVar3 == -0x25) goto LAB_001210d8;
      if (iVar3 == 0) {
        session->startup_state = libssh2_NB_state_sent4;
switchD_00120c35_caseD_7:
        psVar1 = local_50;
        iVar3 = _libssh2_packet_require(session,'\x06',local_48,local_50,0,(uchar *)0x0,0,local_58);
        if (iVar3 == 0) {
          if (*psVar1 < 5) {
            iVar3 = -0xe;
            pcVar8 = "Unexpected packet length";
          }
          else {
            uVar4 = _libssh2_ntohu32(session->startup_data + 1);
            session->startup_service_length = (ulong)uVar4;
            puVar7 = session->startup_data;
            if ((uVar4 == 0xc) &&
               (iVar3 = strncmp("ssh-userauth",(char *)(puVar7 + 5),0xc), iVar3 == 0)) {
              (*session->free)(puVar7,&session->abstract);
              session->startup_data = (uchar *)0x0;
              session->startup_state = libssh2_NB_state_idle;
              return 0;
            }
            (*session->free)(puVar7,&session->abstract);
            session->startup_data = (uchar *)0x0;
            iVar3 = -0xe;
            pcVar8 = "Invalid response received from server";
          }
        }
        else {
          pcVar8 = "Failed to get response to ssh-userauth request";
        }
      }
      else {
        pcVar8 = "Unable to ask for ssh-userauth service";
      }
    }
    else {
      pcVar8 = "Unable to exchange encryption keys";
    }
LAB_001210cb:
    iVar3 = _libssh2_error(session,iVar3,pcVar8);
    if (iVar3 != -0x25) {
      return iVar3;
    }
  }
LAB_001210d8:
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar3 = _libssh2_wait_socket(session,local_38);
  if (iVar3 != 0) {
    return iVar3;
  }
  goto LAB_00120c17;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}